

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.cpp
# Opt level: O2

void __thiscall
DIS::IFFFundamentalParameterData::marshal(IFFFundamentalParameterData *this,DataStream *dataStream)

{
  long lVar1;
  
  DataStream::operator<<(dataStream,this->_erp);
  DataStream::operator<<(dataStream,this->_frequency);
  DataStream::operator<<(dataStream,this->_pgrf);
  DataStream::operator<<(dataStream,this->_pulseWidth);
  DataStream::operator<<(dataStream,this->_burstLength);
  DataStream::operator<<(dataStream,this->_applicableModes);
  for (lVar1 = -3; lVar1 != 0; lVar1 = lVar1 + 1) {
    DataStream::operator<<(dataStream,this[1]._systemSpecificData[lVar1 + -0x1d]);
  }
  return;
}

Assistant:

void IFFFundamentalParameterData::marshal(DataStream& dataStream) const
{
    dataStream << _erp;
    dataStream << _frequency;
    dataStream << _pgrf;
    dataStream << _pulseWidth;
    dataStream << _burstLength;
    dataStream << _applicableModes;

     for(size_t idx = 0; idx < 3; idx++)
     {
        dataStream << _systemSpecificData[idx];
     }

}